

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O0

int __thiscall
CVmResFileSource::clone
          (CVmResFileSource *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  osfildef *poVar1;
  void *start;
  osfildef *fpdup;
  long in_stack_ffffffffffffffb8;
  CVmResFileSource *in_stack_ffffffffffffffd0;
  osfildef *in_stack_ffffffffffffffd8;
  undefined4 local_8;
  
  poVar1 = osfdup(in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0);
  if (poVar1 == (osfildef *)0x0) {
    local_8 = 0;
  }
  else {
    start = operator_new(0x20);
    CVmResFileSource(in_stack_ffffffffffffffd0,(osfildef *)this,(unsigned_long)start,
                     in_stack_ffffffffffffffb8);
    local_8 = (int)start;
  }
  return local_8;
}

Assistant:

virtual CVmDataSource *clone(VMG_ const char *mode)
    {
        /* duplicate our underlying file handle */
        osfildef *fpdup = osfdup(fp, mode);
        if (fpdup == 0)
            return 0;

        /* return a new source wrapping the duplicated file handle */
        return new CVmResFileSource(fpdup, start, end);
    }